

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *mat)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  uint local_30;
  uint local_2c;
  uint j;
  uint t;
  uint i;
  Matrix *mat_local;
  Matrix *this_local;
  Matrix *result;
  
  if ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[0]) {
    Matrix(__return_storage_ptr__,(this->m_shape).field_0.m_dims[0],(mat->m_shape).field_0.m_dims[1]
          );
    for (j = 0; j < (this->m_shape).field_0.m_dims[0]; j = j + 1) {
      for (local_2c = 0; local_2c < (mat->m_shape).field_0.m_dims[1]; local_2c = local_2c + 1) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&__return_storage_ptr__->m_vals,(ulong)j);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(ulong)local_2c);
        *pvVar4 = 0.0;
        for (local_30 = 0; local_30 < (this->m_shape).field_0.m_dims[1]; local_30 = local_30 + 1) {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&this->m_vals,(ulong)j);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_30);
          dVar1 = *pvVar6;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&mat->m_vals,(ulong)local_30);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_2c);
          dVar2 = *pvVar6;
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&__return_storage_ptr__->m_vals,(ulong)j);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(ulong)local_2c);
          *pvVar4 = dVar1 * dVar2 + *pvVar4;
        }
      }
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [* operator]: Shape doesn\'t match!\n");
  exit(1);
}

Assistant:

Matrix Matrix::operator*(const Matrix& mat) const{
    if(m_shape.n_col!=mat.m_shape.n_row){
        std::cout<<"ERROR [* operator]: Shape doesn't match!\n";
        exit(1);
    }
    Matrix result(m_shape.n_row, mat.m_shape.n_col);
    
    for(uint i=0;i<m_shape.n_row;++i){
        for(uint t=0;t<mat.m_shape.n_col;++t){
            result.m_vals[i][t]=0;
            for(uint j=0;j<m_shape.n_col;++j){
                result.m_vals[i][t]+=m_vals[i][j]*mat.m_vals[j][t];
            }
        }
    }
    // std::cout<<"+\n";
    return result;
}